

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
emplaceRealloc<slang::SmallVector<slang::ast::NetAlias,2ul>>
          (SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>> *this,pointer pos,
          SmallVector<slang::ast::NetAlias,_2UL> *args)

{
  SmallVector<slang::ast::NetAlias,_2UL> *this_00;
  ulong uVar1;
  long lVar2;
  SmallVector<slang::ast::NetAlias,_2UL> *pSVar3;
  long lVar4;
  SmallVector<slang::ast::NetAlias,_2UL> *pSVar5;
  ulong uVar6;
  SmallVector<slang::ast::NetAlias,_2UL> *other;
  
  if (*(long *)(this + 8) == 0x1745d1745d1745d) {
    detail::throwLengthError();
  }
  uVar6 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar6 < uVar1 * 2) {
    uVar6 = uVar1 * 2;
  }
  if (0x1745d1745d1745d - uVar1 < uVar1) {
    uVar6 = 0x1745d1745d1745d;
  }
  lVar2 = *(long *)this;
  pSVar3 = (SmallVector<slang::ast::NetAlias,_2UL> *)operator_new(uVar6 * 0x58);
  this_00 = (SmallVector<slang::ast::NetAlias,_2UL> *)((long)pSVar3 + ((long)pos - lVar2));
  SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
            (this_00,&args->super_SmallVectorBase<slang::ast::NetAlias>);
  other = *(SmallVector<slang::ast::NetAlias,_2UL> **)this;
  lVar4 = *(long *)(this + 8);
  if (other + lVar4 == pos) {
    pSVar5 = pSVar3;
    if (lVar4 != 0) {
      do {
        args = other;
        SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
                  (pSVar5,&other->super_SmallVectorBase<slang::ast::NetAlias>);
        other = other + 1;
        pSVar5 = pSVar5 + 1;
      } while (other != pos);
    }
  }
  else {
    pSVar5 = pSVar3;
    if (other != pos) {
      do {
        args = other;
        SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
                  (pSVar5,&other->super_SmallVectorBase<slang::ast::NetAlias>);
        other = other + 1;
        pSVar5 = pSVar5 + 1;
      } while (other != pos);
      other = *(SmallVector<slang::ast::NetAlias,_2UL> **)this;
      lVar4 = *(long *)(this + 8);
    }
    if (other + lVar4 != pos) {
      pSVar5 = (SmallVector<slang::ast::NetAlias,_2UL> *)(((long)pos - lVar2) + (long)pSVar3);
      do {
        pSVar5 = pSVar5 + 1;
        args = pos;
        SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
                  (pSVar5,&pos->super_SmallVectorBase<slang::ast::NetAlias>);
        pos = pos + 1;
      } while (pos != other + lVar4);
    }
  }
  SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::cleanup
            ((SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_> *)this,
             (EVP_PKEY_CTX *)args);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar6;
  *(SmallVector<slang::ast::NetAlias,_2UL> **)this = pSVar3;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}